

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(SupportVectorClassifier *a,SupportVectorClassifier *b)

{
  code *pcVar1;
  bool bVar2;
  SupportVectorsCase SVar3;
  SupportVectorsCase SVar4;
  ClassLabelsCase CVar5;
  ClassLabelsCase CVar6;
  Kernel *a_00;
  Kernel *b_00;
  RepeatedField<int> *a_01;
  RepeatedField<int> *b_01;
  RepeatedPtrField<CoreML::Specification::Coefficients> *a_02;
  RepeatedPtrField<CoreML::Specification::Coefficients> *b_02;
  RepeatedField<double> *pRVar7;
  RepeatedField<double> *pRVar8;
  SparseSupportVectors *pSVar9;
  RepeatedPtrField<CoreML::Specification::SparseVector> *a_03;
  RepeatedPtrField<CoreML::Specification::SparseVector> *b_03;
  DenseSupportVectors *pDVar10;
  RepeatedPtrField<CoreML::Specification::DenseVector> *a_04;
  RepeatedPtrField<CoreML::Specification::DenseVector> *b_04;
  Int64Vector *a_05;
  Int64Vector *b_05;
  StringVector *a_06;
  StringVector *b_06;
  SupportVectorClassifier *b_local;
  SupportVectorClassifier *a_local;
  
  a_00 = SupportVectorClassifier::kernel(a);
  b_00 = SupportVectorClassifier::kernel(b);
  bVar2 = operator!=(a_00,b_00);
  if (bVar2) {
    a_local._7_1_ = false;
  }
  else {
    a_01 = SupportVectorClassifier::numberofsupportvectorsperclass(a);
    b_01 = SupportVectorClassifier::numberofsupportvectorsperclass(b);
    bVar2 = operator!=(a_01,b_01);
    if (bVar2) {
      a_local._7_1_ = false;
    }
    else {
      a_02 = SupportVectorClassifier::coefficients(a);
      b_02 = SupportVectorClassifier::coefficients(b);
      bVar2 = operator!=(a_02,b_02);
      if (bVar2) {
        a_local._7_1_ = false;
      }
      else {
        pRVar7 = SupportVectorClassifier::rho(a);
        pRVar8 = SupportVectorClassifier::rho(b);
        bVar2 = operator!=(pRVar7,pRVar8);
        if (bVar2) {
          a_local._7_1_ = false;
        }
        else {
          pRVar7 = SupportVectorClassifier::proba(a);
          pRVar8 = SupportVectorClassifier::proba(b);
          bVar2 = operator!=(pRVar7,pRVar8);
          if (bVar2) {
            a_local._7_1_ = false;
          }
          else {
            pRVar7 = SupportVectorClassifier::probb(a);
            pRVar8 = SupportVectorClassifier::probb(b);
            bVar2 = operator!=(pRVar7,pRVar8);
            if (bVar2) {
              a_local._7_1_ = false;
            }
            else {
              SVar3 = SupportVectorClassifier::supportVectors_case(a);
              SVar4 = SupportVectorClassifier::supportVectors_case(b);
              if (SVar3 == SVar4) {
                SVar3 = SupportVectorClassifier::supportVectors_case(a);
                if (SVar3 != SUPPORTVECTORS_NOT_SET) {
                  if (SVar3 == kSparseSupportVectors) {
                    pSVar9 = SupportVectorClassifier::sparsesupportvectors(a);
                    a_03 = SparseSupportVectors::vectors(pSVar9);
                    pSVar9 = SupportVectorClassifier::sparsesupportvectors(b);
                    b_03 = SparseSupportVectors::vectors(pSVar9);
                    bVar2 = operator!=(a_03,b_03);
                    if (bVar2) {
                      return false;
                    }
                  }
                  else if (SVar3 == kDenseSupportVectors) {
                    pDVar10 = SupportVectorClassifier::densesupportvectors(a);
                    a_04 = DenseSupportVectors::vectors(pDVar10);
                    pDVar10 = SupportVectorClassifier::densesupportvectors(b);
                    b_04 = DenseSupportVectors::vectors(pDVar10);
                    bVar2 = operator!=(a_04,b_04);
                    if (bVar2) {
                      return false;
                    }
                  }
                }
                CVar5 = SupportVectorClassifier::ClassLabels_case(a);
                CVar6 = SupportVectorClassifier::ClassLabels_case(b);
                if (CVar5 == CVar6) {
                  CVar5 = SupportVectorClassifier::ClassLabels_case(a);
                  if (CVar5 == CLASSLABELS_NOT_SET) {
                    a_local._7_1_ = true;
                  }
                  else if (CVar5 == kStringClassLabels) {
                    a_06 = SupportVectorClassifier::stringclasslabels(a);
                    b_06 = SupportVectorClassifier::stringclasslabels(b);
                    a_local._7_1_ = operator==(a_06,b_06);
                  }
                  else {
                    if (CVar5 != kInt64ClassLabels) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    a_05 = SupportVectorClassifier::int64classlabels(a);
                    b_05 = SupportVectorClassifier::int64classlabels(b);
                    a_local._7_1_ = operator==(a_05,b_05);
                  }
                }
                else {
                  a_local._7_1_ = false;
                }
              }
              else {
                a_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const SupportVectorClassifier& a,
                        const SupportVectorClassifier& b) {
            if (a.kernel() != b.kernel()) {
                return false;
            }
            if (a.numberofsupportvectorsperclass() != b.numberofsupportvectorsperclass()) {
                return false;
            }
            if (a.coefficients() != b.coefficients()) {
                return false;
            }
            if (a.rho() != b.rho()) {
                return false;
            }
            if (a.proba() != b.proba()) {
                return false;
            }
            if (a.probb() != b.probb()) {
                return false;
            }
            if (a.supportVectors_case() != b.supportVectors_case()) {
                return false;
            }
            switch (a.supportVectors_case()) {
                case SupportVectorClassifier::kSparseSupportVectors:
                    if (a.sparsesupportvectors().vectors() != b.sparsesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::kDenseSupportVectors:
                    if (a.densesupportvectors().vectors() != b.densesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::SUPPORTVECTORS_NOT_SET:
                    break;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case SupportVectorClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case SupportVectorClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case SupportVectorClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }